

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::BindingModel::anon_unknown_1::BufferComputeInstance::testResourceAccess
          (TestStatus *__return_storage_ptr__,BufferComputeInstance *this)

{
  VkAllocationCallbacks **this_00;
  VkDescriptorPool pool;
  VkDescriptorSetLayout layout;
  VkBuffer viewA;
  VkBuffer viewB;
  DeviceInterface *pDVar1;
  VkDevice pVVar2;
  VkQueue pVVar3;
  RefData<vk::Handle<(vk::HandleType)8>_> data;
  RefData<vk::Handle<(vk::HandleType)8>_> data_00;
  RefData<vk::Handle<(vk::HandleType)19>_> data_01;
  RefData<vk::Handle<(vk::HandleType)21>_> data_02;
  RefData<vk::Handle<(vk::HandleType)22>_> data_03;
  bool bVar4;
  bool bVar5;
  deUint32 dVar6;
  uint bufferSize;
  uint bufferSize_00;
  deUint32 dVar7;
  Handle<(vk::HandleType)21> *pHVar8;
  Handle<(vk::HandleType)19> *pHVar9;
  Handle<(vk::HandleType)8> *pHVar10;
  ProgramCollection<vk::ProgramBinary> *programCollection;
  Handle<(vk::HandleType)22> *pHVar11;
  VkBufferMemoryBarrier *postBarriers_00;
  VkPipeline pipeline_00;
  VkPipelineLayout pipelineLayout;
  Handle<(vk::HandleType)32> *pHVar12;
  deUint8 *rawUpdateData;
  TestContext *pTVar13;
  TestLog *pTVar14;
  MessageBuilder *pMVar15;
  int iVar16;
  deUint32 offset;
  deUint32 offsetA;
  bool local_9e9;
  Vector<float,_4> *local_998;
  deUint32 local_96c;
  float *local_968;
  float local_930;
  float local_92c;
  allocator<char> local_909;
  string local_908;
  MessageBuilder local_8e8;
  allocator<char> local_761;
  string local_760;
  MessageBuilder local_740;
  Vector<float,_4> local_5c0;
  Vector<float,_4> local_5b0;
  Vector<float,_4> local_5a0;
  Vector<float,_4> local_590;
  undefined4 local_580;
  allocator<char> local_579;
  string local_578;
  VkDescriptorUpdateTemplateKHR local_558;
  deUint64 local_550;
  VkBuffer local_548;
  VkBuffer local_540;
  VkDescriptorSet local_538;
  VkDescriptorUpdateTemplateKHR local_530;
  deUint64 local_528;
  VkBuffer local_520;
  VkBuffer local_518;
  VkBuffer local_510;
  VkDescriptorSetLayout local_508;
  VkDescriptorSet local_500;
  undefined1 local_4f8 [8];
  Vec4 results [4];
  Vec4 references [4];
  Vec4 refQuadrantValue23;
  Vec4 refQuadrantValue14;
  undefined1 local_438 [8];
  ComputeCommand compute;
  int numPostBarriers;
  VkBufferMemoryBarrier *postBarriers;
  int numPreBarriers;
  VkBufferMemoryBarrier *preBarriers;
  deUint32 numDynamicOffsets;
  deUint32 *dynamicOffsets;
  VkDescriptorSet VStack_398;
  int numDescriptorSets;
  VkDescriptorSet descriptorSets [1];
  undefined1 local_388 [4];
  deUint32 numSrcBuffers;
  VkBufferMemoryBarrier bufferBarriers [2];
  undefined1 local_308 [4];
  VkAccessFlags inputBit;
  ComputePipeline pipeline;
  Move<vk::Handle<(vk::HandleType)22>_> local_2a0;
  RefData<vk::Handle<(vk::HandleType)22>_> local_280;
  undefined1 local_260 [8];
  Unique<vk::Handle<(vk::HandleType)22>_> descriptorSet;
  RefData<vk::Handle<(vk::HandleType)21>_> local_220;
  undefined1 local_200 [8];
  Unique<vk::Handle<(vk::HandleType)21>_> descriptorPool;
  RefData<vk::Handle<(vk::HandleType)19>_> local_1c0;
  undefined1 local_1a0 [8];
  Unique<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  RefData<vk::Handle<(vk::HandleType)8>_> local_160;
  undefined1 local_140 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> bufferB;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> bufferMemB;
  Move<vk::Handle<(vk::HandleType)8>_> local_100;
  RefData<vk::Handle<(vk::HandleType)8>_> local_e0;
  undefined1 local_c0 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> bufferA;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> bufferMemA;
  deUint32 bufferSizeB;
  deUint32 bufferSizeA;
  deUint32 viewOffsetB;
  deUint32 viewOffsetA;
  deUint32 dataOffsetB;
  deUint32 dataOffsetA;
  Vec4 colorB2;
  Vec4 colorB1;
  Vec4 colorA2;
  Vec4 colorA1;
  deUint32 bindTimeOffsets [2];
  bool isUniformBuffer;
  bool isDynamicCase;
  BufferComputeInstance *this_local;
  
  bVar4 = isDynamicDescriptorType(this->m_descriptorType);
  bVar5 = isUniformDescriptorType(this->m_descriptorType);
  colorA1.m_data[2] = 0.0;
  if ((this->m_dynamicOffsetNonZero & 1U) != 0) {
    colorA1.m_data[2] = 7.17465e-43;
  }
  colorA1.m_data[3] = 0.0;
  if ((this->m_dynamicOffsetNonZero & 1U) != 0) {
    colorA1.m_data[3] = 1.0762e-42;
  }
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colorA2.m_data + 2),0.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colorB1.m_data + 2),1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colorB2.m_data + 2),1.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&dataOffsetB,0.0,0.0,1.0,1.0);
  if (bVar4) {
    local_92c = colorA1.m_data[2];
  }
  else {
    local_92c = 0.0;
  }
  iVar16 = 0;
  if ((this->m_setViewOffset & 1U) != 0) {
    iVar16 = 0x100;
  }
  if (bVar4) {
    local_930 = colorA1.m_data[3];
  }
  else {
    local_930 = 0.0;
  }
  offset = (int)local_930 + (this->m_setViewOffset & 1) * 0x400;
  offsetA = (this->m_setViewOffset & 1) << 8;
  dVar6 = (this->m_setViewOffset & 1) << 10;
  bufferSize = (int)local_92c + iVar16 + 0x100;
  bufferSize_00 = offset + 0x100;
  this_00 = &bufferA.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)this_00);
  createColorDataBuffer
            (&local_100,this,(int)local_92c + iVar16,bufferSize,(Vec4 *)(colorA2.m_data + 2),
             (Vec4 *)(colorB1.m_data + 2),
             (MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)this_00);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_e0,(Move *)&local_100);
  data.deleter.m_deviceIface._0_4_ = (int)local_e0.deleter.m_deviceIface;
  data.object.m_internal = local_e0.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_e0.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device._0_4_ = (int)local_e0.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_e0.deleter.m_device >> 0x20);
  data.deleter.m_allocator = local_e0.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_c0,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_100);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
             &bufferB.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator);
  dVar7 = getInterfaceNumResources(this->m_shaderInterface);
  if (dVar7 == 1) {
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move
              ((Move<vk::Handle<(vk::HandleType)8>_> *)
               &descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
                m_allocator);
  }
  else {
    createColorDataBuffer
              ((Move<vk::Handle<(vk::HandleType)8>_> *)
               &descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
                m_allocator,this,offset,bufferSize_00,(Vec4 *)(colorB2.m_data + 2),
               (Vec4 *)&dataOffsetB,
               (MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
               &bufferB.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator);
  }
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_160,
             (Move *)&descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
                      deleter.m_allocator);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_160.deleter.m_deviceIface;
  data_00.object.m_internal = local_160.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_160.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device._0_4_ = (int)local_160.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_160.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator = local_160.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_140,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
              m_allocator);
  createDescriptorSetLayout
            ((Move<vk::Handle<(vk::HandleType)19>_> *)
             &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator,this);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_1c0,
             (Move *)&descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
                      m_allocator);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_1c0.deleter.m_deviceIface;
  data_01.object.m_internal = local_1c0.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_1c0.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device._0_4_ = (int)local_1c0.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_1c0.deleter.m_device >> 0x20);
  data_01.deleter.m_allocator = local_1c0.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_1a0,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)19>_> *)
             &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  createDescriptorPool
            ((Move<vk::Handle<(vk::HandleType)21>_> *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool,
             this);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_220,
             (Move *)&descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                      m_pool);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_220.deleter.m_deviceIface;
  data_02.object.m_internal = local_220.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_220.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device._0_4_ = (int)local_220.deleter.m_device;
  data_02.deleter.m_device._4_4_ = (int)((ulong)local_220.deleter.m_device >> 0x20);
  data_02.deleter.m_allocator = local_220.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_200,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)21>_> *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)21>_> *)local_200);
  pool.m_internal = pHVar8->m_internal;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_1a0);
  layout.m_internal = pHVar9->m_internal;
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_c0);
  viewA.m_internal = pHVar10->m_internal;
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_140);
  viewB.m_internal = pHVar10->m_internal;
  pipeline.m_pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)ComputeInstanceResultBuffer::getBuffer(&this->m_result);
  createDescriptorSet(&local_2a0,this,pool,layout,viewA,offsetA,viewB,dVar6,
                      (VkBuffer)
                      pipeline.m_pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.
                      deleter.m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_280,(Move *)&local_2a0);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_280.deleter.m_deviceIface;
  data_03.object.m_internal = local_280.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_280.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device._0_4_ = (int)local_280.deleter.m_device;
  data_03.deleter.m_device._4_4_ = (int)((ulong)local_280.deleter.m_device >> 0x20);
  data_03.deleter.m_pool.m_internal = local_280.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_260,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_2a0);
  pDVar1 = this->m_vki;
  pVVar2 = this->m_device;
  programCollection = Context::getBinaryCollection((this->super_TestInstance).m_context);
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::get
                     ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_1a0);
  ComputePipeline::ComputePipeline
            ((ComputePipeline *)local_308,pDVar1,pVVar2,programCollection,1,pHVar9);
  bufferBarriers[1].pNext._4_4_ = 0x20;
  if (bVar5) {
    bufferBarriers[1].pNext._4_4_ = 8;
  }
  local_388 = (undefined1  [4])0x2c;
  bufferBarriers[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferBarriers[0]._4_4_ = 0;
  bufferBarriers[0].pNext._0_4_ = 0x4000;
  bufferBarriers[0].srcAccessMask = 0xffffffff;
  bufferBarriers[0].dstAccessMask = 0xffffffff;
  bufferBarriers[0].pNext._4_4_ = bufferBarriers[1].pNext._4_4_;
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_c0);
  bufferBarriers[0]._24_8_ = pHVar10->m_internal;
  bufferBarriers[0].buffer.m_internal = 0;
  bufferBarriers[0].offset = (VkDeviceSize)bufferSize;
  bufferBarriers[0].size._0_4_ = 0x2c;
  bufferBarriers[1].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferBarriers[1]._4_4_ = 0;
  bufferBarriers[1].pNext._0_4_ = 0x4000;
  bufferBarriers[1].srcAccessMask = 0xffffffff;
  bufferBarriers[1].dstAccessMask = 0xffffffff;
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_140);
  bufferBarriers[1]._24_8_ = pHVar10->m_internal;
  bufferBarriers[1].buffer.m_internal = 0;
  bufferBarriers[1].offset = (VkDeviceSize)bufferSize_00;
  descriptorSets[0].m_internal._4_4_ = getInterfaceNumResources(this->m_shaderInterface);
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_260);
  dVar7 = descriptorSets[0].m_internal._4_4_;
  VStack_398.m_internal = pHVar11->m_internal;
  bVar4 = true;
  if (this->m_updateMethod != DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE) {
    bVar4 = this->m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH;
  }
  if ((this->m_setDynamicOffset & 1U) == 0) {
    local_968 = (float *)0x0;
  }
  else {
    local_968 = colorA1.m_data + 2;
  }
  if ((this->m_setDynamicOffset & 1U) == 0) {
    local_96c = 0;
  }
  else {
    local_96c = descriptorSets[0].m_internal._4_4_;
  }
  postBarriers_00 = ComputeInstanceResultBuffer::getResultReadBarrier(&this->m_result);
  compute.m_postBarriers._4_4_ = 1;
  pDVar1 = this->m_vki;
  pVVar2 = this->m_device;
  pipeline_00 = ComputePipeline::getPipeline((ComputePipeline *)local_308);
  pipelineLayout = ComputePipeline::getPipelineLayout((ComputePipeline *)local_308);
  tcu::Vector<unsigned_int,_3>::Vector
            ((Vector<unsigned_int,_3> *)(refQuadrantValue14.m_data + 2),4,1,1);
  ComputeCommand::ComputeCommand
            ((ComputeCommand *)local_438,pDVar1,pVVar2,pipeline_00,pipelineLayout,
             (UVec3 *)(refQuadrantValue14.m_data + 2),(uint)!bVar4,&stack0xfffffffffffffc68,
             local_96c,(deUint32 *)local_968,dVar7,(VkBufferMemoryBarrier *)local_388,1,
             postBarriers_00);
  if (this->m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR) {
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(refQuadrantValue23.m_data + 2),
               (Vector<float,_4> *)(colorB1.m_data + 2));
  }
  else if (this->m_shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(refQuadrantValue23.m_data + 2),(Vector<float,_4> *)&dataOffsetB)
    ;
  }
  else if (this->m_shaderInterface == SHADER_INPUT_DESCRIPTOR_ARRAY) {
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(refQuadrantValue23.m_data + 2),(Vector<float,_4> *)&dataOffsetB)
    ;
  }
  else {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(refQuadrantValue23.m_data + 2),-2.0);
  }
  if (this->m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR) {
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(references[3].m_data + 3),
               (Vector<float,_4> *)(colorA2.m_data + 2));
  }
  else if (this->m_shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(references[3].m_data + 3),
               (Vector<float,_4> *)(colorA2.m_data + 2));
  }
  else if (this->m_shaderInterface == SHADER_INPUT_DESCRIPTOR_ARRAY) {
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(references[3].m_data + 3),
               (Vector<float,_4> *)(colorA2.m_data + 2));
  }
  else {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(references[3].m_data + 3),-2.0);
  }
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(results[3].m_data + 2),
             (Vector<float,_4> *)(refQuadrantValue23.m_data + 2));
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(references[0].m_data + 2),
             (Vector<float,_4> *)(references[3].m_data + 3));
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(references[1].m_data + 2),
             (Vector<float,_4> *)(references[3].m_data + 3));
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(references[2].m_data + 2),
             (Vector<float,_4> *)(refQuadrantValue23.m_data + 2));
  local_998 = (Vector<float,_4> *)local_4f8;
  do {
    tcu::Vector<float,_4>::Vector(local_998);
    local_998 = local_998 + 1;
  } while (local_998 != (Vector<float,_4> *)(results[3].m_data + 2));
  if (this->m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE) {
    ::vk::Handle<(vk::HandleType)22>::Handle(&local_500,0);
    pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                       ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_1a0);
    local_508.m_internal = pHVar9->m_internal;
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_c0);
    local_510.m_internal = pHVar10->m_internal;
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_140);
    local_518.m_internal = pHVar10->m_internal;
    local_520 = ComputeInstanceResultBuffer::getBuffer(&this->m_result);
    local_528 = (deUint64)ComputePipeline::getPipelineLayout((ComputePipeline *)local_308);
    writeDescriptorSetWithTemplate
              (this,local_500,local_508,local_510,offsetA,local_518,dVar6,local_520,true,
               (VkPipelineLayout)local_528);
    dVar6 = this->m_queueFamilyIndex;
    pVVar3 = this->m_queue;
    pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)32>_>::operator*
                        (&(this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>);
    local_530.m_internal = pHVar12->m_internal;
    rawUpdateData = RawUpdateRegistry::getRawPointer(&this->m_updateRegistry);
    ComputeCommand::submitAndWait((ComputeCommand *)local_438,dVar6,pVVar3,local_530,rawUpdateData);
  }
  else if (this->m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH) {
    ::vk::Handle<(vk::HandleType)22>::Handle(&local_538,0);
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_c0);
    local_540.m_internal = pHVar10->m_internal;
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_140);
    local_548.m_internal = pHVar10->m_internal;
    local_550 = (deUint64)ComputeInstanceResultBuffer::getBuffer(&this->m_result);
    writeDescriptorSet(this,local_538,local_540,offsetA,local_548,dVar6,(VkBuffer)local_550);
    ComputeCommand::submitAndWait
              ((ComputeCommand *)local_438,this->m_queueFamilyIndex,this->m_queue,
               &this->m_updateBuilder);
  }
  else {
    dVar6 = this->m_queueFamilyIndex;
    pVVar3 = this->m_queue;
    ::vk::Handle<(vk::HandleType)32>::Handle(&local_558,0);
    ComputeCommand::submitAndWait((ComputeCommand *)local_438,dVar6,pVVar3,local_558,(void *)0x0);
  }
  ComputeInstanceResultBuffer::readResultContentsTo(&this->m_result,(Vec4 (*) [4])local_4f8);
  bVar4 = tcu::Vector<float,_4>::operator==
                    ((Vector<float,_4> *)local_4f8,(Vector<float,_4> *)(results[3].m_data + 2));
  if ((((bVar4) &&
       (bVar4 = tcu::Vector<float,_4>::operator==
                          ((Vector<float,_4> *)(results[0].m_data + 2),
                           (Vector<float,_4> *)(references[0].m_data + 2)), bVar4)) &&
      (bVar4 = tcu::Vector<float,_4>::operator==
                         ((Vector<float,_4> *)(results[1].m_data + 2),
                          (Vector<float,_4> *)(references[1].m_data + 2)), bVar4)) &&
     (bVar4 = tcu::Vector<float,_4>::operator==
                        ((Vector<float,_4> *)(results[2].m_data + 2),
                         (Vector<float,_4> *)(references[2].m_data + 2)), bVar4)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_578,"Pass",&local_579);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_578);
    std::__cxx11::string::~string((string *)&local_578);
    std::allocator<char>::~allocator(&local_579);
  }
  else {
    tcu::Vector<float,_4>::Vector(&local_590,-1.0);
    bVar4 = tcu::Vector<float,_4>::operator==((Vector<float,_4> *)local_4f8,&local_590);
    local_9e9 = false;
    if (bVar4) {
      tcu::Vector<float,_4>::Vector(&local_5a0,-1.0);
      bVar4 = tcu::Vector<float,_4>::operator==
                        ((Vector<float,_4> *)(results[0].m_data + 2),&local_5a0);
      local_9e9 = false;
      if (bVar4) {
        tcu::Vector<float,_4>::Vector(&local_5b0,-1.0);
        bVar4 = tcu::Vector<float,_4>::operator==
                          ((Vector<float,_4> *)(results[1].m_data + 2),&local_5b0);
        local_9e9 = false;
        if (bVar4) {
          tcu::Vector<float,_4>::Vector(&local_5c0,-1.0);
          local_9e9 = tcu::Vector<float,_4>::operator==
                                ((Vector<float,_4> *)(results[2].m_data + 2),&local_5c0);
        }
      }
    }
    if (local_9e9 == false) {
      pTVar13 = Context::getTestContext((this->super_TestInstance).m_context);
      pTVar14 = tcu::TestContext::getLog(pTVar13);
      tcu::TestLog::operator<<(&local_8e8,pTVar14,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar15 = tcu::MessageBuilder::operator<<(&local_8e8,(char (*) [17])"Error expected [");
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(Vector<float,_4> *)(results[3].m_data + 2))
      ;
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x132ea91);
      pMVar15 = tcu::MessageBuilder::operator<<
                          (pMVar15,(Vector<float,_4> *)(references[0].m_data + 2));
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x132ea91);
      pMVar15 = tcu::MessageBuilder::operator<<
                          (pMVar15,(Vector<float,_4> *)(references[1].m_data + 2));
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x132ea91);
      pMVar15 = tcu::MessageBuilder::operator<<
                          (pMVar15,(Vector<float,_4> *)(references[2].m_data + 2));
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [9])"], got [");
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(Vector<float,_4> *)local_4f8);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x132ea91);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(Vector<float,_4> *)(results[0].m_data + 2))
      ;
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x132ea91);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(Vector<float,_4> *)(results[1].m_data + 2))
      ;
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x132ea91);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(Vector<float,_4> *)(results[2].m_data + 2))
      ;
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [2])0x12d726b);
      tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_8e8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_908,"Invalid result values",&local_909);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_908);
      std::__cxx11::string::~string((string *)&local_908);
      std::allocator<char>::~allocator(&local_909);
    }
    else {
      pTVar13 = Context::getTestContext((this->super_TestInstance).m_context);
      pTVar14 = tcu::TestContext::getLog(pTVar13);
      tcu::TestLog::operator<<(&local_740,pTVar14,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar15 = tcu::MessageBuilder::operator<<
                          (&local_740,(char (*) [34])"Result buffer was not written to.");
      tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_740);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_760,"Result buffer was not written to",&local_761);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_760);
      std::__cxx11::string::~string((string *)&local_760);
      std::allocator<char>::~allocator(&local_761);
    }
  }
  local_580 = 1;
  ComputePipeline::~ComputePipeline((ComputePipeline *)local_308);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_260);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_200);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_1a0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_140);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
             &bufferB.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_c0);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
             &bufferA.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus BufferComputeInstance::testResourceAccess (void)
{
	enum
	{
		ADDRESSABLE_SIZE = 256, // allocate a lot more than required
	};

	const bool										isDynamicCase		= isDynamicDescriptorType(m_descriptorType);
	const bool										isUniformBuffer		= isUniformDescriptorType(m_descriptorType);
	const deUint32									bindTimeOffsets[]	=
	{
		(m_dynamicOffsetNonZero) ? ((deUint32)DYNAMIC_OFFSET_VALUE_A) : (0u),
		(m_dynamicOffsetNonZero) ? ((deUint32)DYNAMIC_OFFSET_VALUE_B) : (0u),
	};

	const tcu::Vec4									colorA1				= tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4									colorA2				= tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4									colorB1				= tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
	const tcu::Vec4									colorB2				= tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f);

	const deUint32									dataOffsetA			= ((isDynamicCase) ? (bindTimeOffsets[0]) : 0) + ((m_setViewOffset) ? ((deUint32)STATIC_OFFSET_VALUE_A) : (0u));
	const deUint32									dataOffsetB			= ((isDynamicCase) ? (bindTimeOffsets[1]) : 0) + ((m_setViewOffset) ? ((deUint32)STATIC_OFFSET_VALUE_B) : (0u));
	const deUint32									viewOffsetA			= (m_setViewOffset) ? ((deUint32)STATIC_OFFSET_VALUE_A) : (0u);
	const deUint32									viewOffsetB			= (m_setViewOffset) ? ((deUint32)STATIC_OFFSET_VALUE_B) : (0u);
	const deUint32									bufferSizeA			= dataOffsetA + ADDRESSABLE_SIZE;
	const deUint32									bufferSizeB			= dataOffsetB + ADDRESSABLE_SIZE;

	de::MovePtr<vk::Allocation>						bufferMemA;
	const vk::Unique<vk::VkBuffer>					bufferA				(createColorDataBuffer(dataOffsetA, bufferSizeA, colorA1, colorA2, &bufferMemA));

	de::MovePtr<vk::Allocation>						bufferMemB;
	const vk::Unique<vk::VkBuffer>					bufferB				((getInterfaceNumResources(m_shaderInterface) == 1u)
																			? (vk::Move<vk::VkBuffer>())
																			: (createColorDataBuffer(dataOffsetB, bufferSizeB, colorB1, colorB2, &bufferMemB)));

	const vk::Unique<vk::VkDescriptorSetLayout>		descriptorSetLayout	(createDescriptorSetLayout());
	const vk::Unique<vk::VkDescriptorPool>			descriptorPool		(createDescriptorPool());
	const vk::Unique<vk::VkDescriptorSet>			descriptorSet		(createDescriptorSet(*descriptorPool, *descriptorSetLayout, *bufferA, viewOffsetA, *bufferB, viewOffsetB, m_result.getBuffer()));
	const ComputePipeline							pipeline			(m_vki, m_device, m_context.getBinaryCollection(), 1, &descriptorSetLayout.get());

	const vk::VkAccessFlags							inputBit			= (isUniformBuffer) ? (vk::VK_ACCESS_UNIFORM_READ_BIT) : (vk::VK_ACCESS_SHADER_READ_BIT);
	const vk::VkBufferMemoryBarrier					bufferBarriers[]	=
	{
		{
			vk::VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,
			DE_NULL,
			vk::VK_ACCESS_HOST_WRITE_BIT,				// outputMask
			inputBit,									// inputMask
			VK_QUEUE_FAMILY_IGNORED,					// srcQueueFamilyIndex
			VK_QUEUE_FAMILY_IGNORED,					// destQueueFamilyIndex
			*bufferA,									// buffer
			(vk::VkDeviceSize)0u,						// offset
			(vk::VkDeviceSize)bufferSizeA,				// size
		},
		{
			vk::VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,
			DE_NULL,
			vk::VK_ACCESS_HOST_WRITE_BIT,				// outputMask
			inputBit,									// inputMask
			VK_QUEUE_FAMILY_IGNORED,					// srcQueueFamilyIndex
			VK_QUEUE_FAMILY_IGNORED,					// destQueueFamilyIndex
			*bufferB,									// buffer
			(vk::VkDeviceSize)0u,						// offset
			(vk::VkDeviceSize)bufferSizeB,				// size
		}
	};

	const deUint32									numSrcBuffers		= getInterfaceNumResources(m_shaderInterface);

	const vk::VkDescriptorSet						descriptorSets[]	= { *descriptorSet };
	const int										numDescriptorSets	= (m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE || m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH) ? 0 : DE_LENGTH_OF_ARRAY(descriptorSets);
	const deUint32* const							dynamicOffsets		= (m_setDynamicOffset) ? (bindTimeOffsets) : (DE_NULL);
	const deUint32									numDynamicOffsets	= (m_setDynamicOffset) ? (numSrcBuffers) : (0);
	const vk::VkBufferMemoryBarrier* const			preBarriers			= bufferBarriers;
	const int										numPreBarriers		= numSrcBuffers;
	const vk::VkBufferMemoryBarrier* const			postBarriers		= m_result.getResultReadBarrier();
	const int										numPostBarriers		= 1;

	const ComputeCommand							compute				(m_vki,
																		 m_device,
																		 pipeline.getPipeline(),
																		 pipeline.getPipelineLayout(),
																		 tcu::UVec3(4, 1, 1),
																		 numDescriptorSets,	descriptorSets,
																		 numDynamicOffsets,	dynamicOffsets,
																		 numPreBarriers,	preBarriers,
																		 numPostBarriers,	postBarriers);

	const tcu::Vec4									refQuadrantValue14	= (m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR)						? (colorA2) :
																		  (m_shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS)		? (colorB2) :
																		  (m_shaderInterface == SHADER_INPUT_DESCRIPTOR_ARRAY)						? (colorB2) :
																																					(tcu::Vec4(-2.0f));
	const tcu::Vec4									refQuadrantValue23	= (m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR)						? (colorA1) :
																		  (m_shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS)		? (colorA1) :
																		  (m_shaderInterface == SHADER_INPUT_DESCRIPTOR_ARRAY)						? (colorA1) :
																																					(tcu::Vec4(-2.0f));
	const tcu::Vec4									references[4]		=
	{
		refQuadrantValue14,
		refQuadrantValue23,
		refQuadrantValue23,
		refQuadrantValue14,
	};
	tcu::Vec4										results[4];

	if (m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE)
	{
		writeDescriptorSetWithTemplate(DE_NULL, *descriptorSetLayout, *bufferA, viewOffsetA, *bufferB, viewOffsetB, m_result.getBuffer(), true, pipeline.getPipelineLayout());
		compute.submitAndWait(m_queueFamilyIndex, m_queue, *m_updateTemplate, (const void*) m_updateRegistry.getRawPointer());
	}
	else if (m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH)
	{
		writeDescriptorSet(DE_NULL, *bufferA, viewOffsetA, *bufferB, viewOffsetB, m_result.getBuffer());
		compute.submitAndWait(m_queueFamilyIndex, m_queue, m_updateBuilder);
	}
	else
	{
		compute.submitAndWait(m_queueFamilyIndex, m_queue);
	}
	m_result.readResultContentsTo(&results);

	// verify
	if (results[0] == references[0] &&
		results[1] == references[1] &&
		results[2] == references[2] &&
		results[3] == references[3])
	{
		return tcu::TestStatus::pass("Pass");
	}
	else if (results[0] == tcu::Vec4(-1.0f) &&
			 results[1] == tcu::Vec4(-1.0f) &&
			 results[2] == tcu::Vec4(-1.0f) &&
			 results[3] == tcu::Vec4(-1.0f))
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "Result buffer was not written to."
			<< tcu::TestLog::EndMessage;
		return tcu::TestStatus::fail("Result buffer was not written to");
	}
	else
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "Error expected ["
				<< references[0] << ", "
				<< references[1] << ", "
				<< references[2] << ", "
				<< references[3] << "], got ["
				<< results[0] << ", "
				<< results[1] << ", "
				<< results[2] << ", "
				<< results[3] << "]"
			<< tcu::TestLog::EndMessage;
		return tcu::TestStatus::fail("Invalid result values");
	}
}